

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O1

void __thiscall
CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  TrueWithString gtest_msg;
  TypeParam mtx;
  AssertHelper local_d0;
  char *local_c8;
  char *pcStack_c0;
  char local_b8 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_98 [4];
  mutex_base local_78;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_78);
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  pcStack_c0 = (char *)0x0;
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_c8 = local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::lock(&local_78);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  pcStack_c0 = (char *)0x0;
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_c8 = local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_98[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
    yamc::checked::timed_mutex::
    do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              ((timed_mutex *)&local_78,local_98,"recursive try_lock_until");
  }
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,pcStack_c0,0x1c31be);
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0xf1,local_c8);
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (local_98[0].__d.__r != 0) {
    (**(code **)(*(long *)local_98[0].__d.__r + 8))();
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  pcStack_c0 = (char *)0x0;
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_c8 = local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::mutex_base::unlock(&local_78);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_78);
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockUntil) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_until(std::chrono::system_clock::now()));
  ASSERT_NO_THROW(mtx.unlock());
}